

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O2

int __thiscall MeCab::POSIDGenerator::open(POSIDGenerator *this,char *__file,int __oflag,...)

{
  ostream *poVar1;
  istream *piVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  die local_281;
  Iconv *local_280;
  char *col [2];
  string line;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,__file,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    local_280 = ___oflag;
    while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&ifs,(string *)&line),
          ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      if (local_280 != (Iconv *)0x0) {
        Iconv::convert(local_280,&line);
      }
      sVar3 = tokenize2<char**>(line._M_dataplus._M_p," \t",col,2);
      pcVar5 = col[1];
      if (sVar3 != 2) {
        poVar1 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                );
        poVar1 = std::operator<<(poVar1,"(");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xdb);
        poVar1 = std::operator<<(poVar1,") [");
        poVar1 = std::operator<<(poVar1,"n == 2");
        poVar1 = std::operator<<(poVar1,"] ");
        poVar1 = std::operator<<(poVar1,"format error: ");
        std::operator<<(poVar1,(string *)&line);
        die::~die(&local_281);
        pcVar5 = col[1];
      }
      for (; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
        if (9 < (byte)(*pcVar5 - 0x30U)) {
          poVar1 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                  );
          poVar1 = std::operator<<(poVar1,"(");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xdd);
          poVar1 = std::operator<<(poVar1,") [");
          poVar1 = std::operator<<(poVar1,"*p >= \'0\' && *p <= \'9\'");
          poVar1 = std::operator<<(poVar1,"] ");
          poVar1 = std::operator<<(poVar1,"not a number: ");
          std::operator<<(poVar1,col[1]);
          die::~die(&local_281);
        }
      }
      std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
                ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this,
                 ((long)(this->rewrite_).
                        super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
                        super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rewrite_).
                       super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
                       super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30 + 1);
      RewritePattern::set_pattern
                ((this->rewrite_).
                 super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
                 super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1,col[0],col[1]);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,__file);
    poVar1 = std::operator<<(poVar1," is not found. minimum setting is used");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
              ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this,1);
    RewritePattern::set_pattern
              ((this->rewrite_).
               super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
               super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1,"*","1");
  }
  uVar4 = std::ifstream::~ifstream(&ifs);
  return (int)CONCAT71((int7)((ulong)uVar4 >> 8),1);
}

Assistant:

bool POSIDGenerator::open(const char *filename,
                          Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    std::cerr << filename
              << " is not found. minimum setting is used" << std::endl;
    rewrite_.resize(1);
    rewrite_.back().set_pattern("*", "1");
    return true;
  }

  std::string line;
  char *col[2];
  while (std::getline(ifs, line)) {
    if (iconv) iconv->convert(&line);
    const size_t n = tokenize2(const_cast<char *>(line.c_str()),
                               " \t", col, 2);
    CHECK_DIE(n == 2) << "format error: " << line;
    for (char *p = col[1]; *p; ++p) {
      CHECK_DIE(*p >= '0' && *p <= '9') << "not a number: " << col[1];
    }
    rewrite_.resize(rewrite_.size() + 1);
    rewrite_.back().set_pattern(col[0], col[1]);
  }
  return true;
}